

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

void btRemoveRowCol(btScalar *A,int n,int nskip,int r)

{
  void *pvVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  btScalar *Asrc_2;
  int i_2;
  btScalar *Adst_2;
  size_t cpy_size_1;
  btScalar *Asrc_1;
  int i_1;
  btScalar *Adst_1;
  size_t cpy_size;
  btScalar *Asrc;
  int i;
  btScalar *Adst;
  size_t move_size;
  undefined4 local_6c;
  undefined8 local_68;
  undefined4 local_4c;
  undefined8 local_48;
  undefined4 local_2c;
  undefined8 local_28;
  
  if (in_ECX < in_ESI + -1) {
    if (0 < in_ECX) {
      local_28 = (void *)(in_RDI + (long)in_ECX * 4);
      for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
        memmove(local_28,(void *)((long)local_28 + 4),(long)((in_ESI - in_ECX) + -1) << 2);
        local_28 = (void *)((long)local_28 + (long)in_EDX * 4);
      }
      local_48 = (void *)(in_RDI + (long)(in_ECX * in_EDX) * 4);
      for (local_4c = in_ECX; local_4c < in_ESI + -1; local_4c = local_4c + 1) {
        pvVar1 = (void *)((long)local_48 + (long)in_EDX * 4);
        memcpy(local_48,pvVar1,(long)in_ECX << 2);
        local_48 = pvVar1;
      }
    }
    local_68 = (void *)(in_RDI + (long)(in_ECX * (in_EDX + 1)) * 4);
    for (local_6c = in_ECX; local_6c < in_ESI + -1; local_6c = local_6c + 1) {
      pvVar1 = (void *)((long)local_68 + (long)(in_EDX + 1) * 4);
      memcpy(local_68,pvVar1,(long)((in_ESI - in_ECX) + -1) << 2);
      local_68 = (void *)((long)pvVar1 + -4);
    }
  }
  return;
}

Assistant:

void btRemoveRowCol (btScalar *A, int n, int nskip, int r)
{
  btAssert(A && n > 0 && nskip >= n && r >= 0 && r < n);
  if (r >= n-1) return;
  if (r > 0) {
    {
      const size_t move_size = (n-r-1)*sizeof(btScalar);
      btScalar *Adst = A + r;
      for (int i=0; i<r; Adst+=nskip,++i) {
        btScalar *Asrc = Adst + 1;
        memmove (Adst,Asrc,move_size);
      }
    }
    {
      const size_t cpy_size = r*sizeof(btScalar);
      btScalar *Adst = A + r * nskip;
      for (int i=r; i<(n-1); ++i) {
        btScalar *Asrc = Adst + nskip;
        memcpy (Adst,Asrc,cpy_size);
        Adst = Asrc;
      }
    }
  }
  {
    const size_t cpy_size = (n-r-1)*sizeof(btScalar);
    btScalar *Adst = A + r * (nskip + 1);
    for (int i=r; i<(n-1); ++i) {
      btScalar *Asrc = Adst + (nskip + 1);
      memcpy (Adst,Asrc,cpy_size);
      Adst = Asrc - 1;
    }
  }
}